

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcSystemFurnitureElementType *in;
  
  in = (IfcSystemFurnitureElementType *)operator_new(0x1b8);
  *(undefined ***)&(in->super_IfcFurnishingElementType).field_0x1a0 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0x1a8 = 0;
  *(char **)&in->field_0x1b0 = "IfcSystemFurnitureElementType";
  Assimp::IFC::Schema_2x3::IfcFurnishingElementType::IfcFurnishingElementType
            ((IfcFurnishingElementType *)in,&PTR_construction_vtable_24__0084f950);
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = &PTR__IfcSystemFurnitureElementType_0084f820;
  *(undefined ***)&(in->super_IfcFurnishingElementType).field_0x1a0 =
       &PTR__IfcSystemFurnitureElementType_0084f938;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = &PTR__IfcSystemFurnitureElementType_0084f848;
  (in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject
  .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSystemFurnitureElementType_0084f870;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = &PTR__IfcSystemFurnitureElementType_0084f898;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       &PTR__IfcSystemFurnitureElementType_0084f8c0;
  *(undefined ***)&(in->super_IfcFurnishingElementType).super_IfcElementType.field_0x180 =
       &PTR__IfcSystemFurnitureElementType_0084f8e8;
  *(undefined ***)&(in->super_IfcFurnishingElementType).super_IfcElementType.field_0x190 =
       &PTR__IfcSystemFurnitureElementType_0084f910;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType>(db,params,in);
  return (Object *)
         (&(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcFurnishingElementType).super_IfcElementType.
                             super_IfcTypeProduct.super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }